

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLrelation.c
# Opt level: O2

void RDL_checkDependencies(RDL_cfURF *RCFs,RDL_graph *graph,RDL_URFinfo *uInfo)

{
  ulong uVar1;
  uchar uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uchar **rows;
  uchar **rows_00;
  uchar **rows_01;
  void *__ptr;
  uchar *empty_cycle;
  uchar *cycle;
  uchar *cycle_00;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uchar **compressed;
  uint nof_rows;
  uint pos;
  ulong uVar11;
  uint local_a4;
  ulong local_a0;
  
  uVar6 = (ulong)RCFs->nofFams;
  if (uVar6 < 3) {
    for (uVar6 = 0; uVar6 < uInfo->nofWeights; uVar6 = uVar6 + 1) {
      for (uVar7 = 0; uVar7 < uInfo->nofProtos[uVar6]; uVar7 = uVar7 + 1) {
        uInfo->URFrel[uVar6][uVar7][uVar7] = '\x01';
      }
    }
    uVar3 = RCFs->nofFams;
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      RCFs->fams[uVar6]->mark = 1;
    }
    return;
  }
  rows = (uchar **)malloc((ulong)((graph->E - graph->V) + 1) << 3);
  rows_00 = (uchar **)malloc(uVar6 * 8);
  rows_01 = (uchar **)malloc(uVar6 * 8);
  __ptr = malloc(uVar6 << 2);
  uVar3 = 0;
  compressed = rows_00;
  for (uVar7 = 0; uVar7 < uVar6; uVar7 = uVar7 + 1) {
    uVar3 = RDL_bitset_compressed(compressed,RCFs->fams[uVar7]->prototype,graph->E);
    uVar6 = (ulong)RCFs->nofFams;
    compressed = compressed + 1;
  }
  uVar7 = (ulong)uVar3;
  empty_cycle = (uchar *)calloc(1,uVar7);
  uVar6 = 0;
  local_a4 = 0;
  local_a0 = 0;
  do {
    uVar1 = local_a0;
    uVar8 = (ulong)local_a4;
    if (uInfo->nofWeights <= uVar6) {
      for (uVar6 = 0; local_a0 != uVar6; uVar6 = uVar6 + 1) {
        free(rows[uVar6]);
      }
      free(rows);
      for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
        free(rows_01[uVar6]);
      }
      free(rows_01);
      free(__ptr);
      for (uVar6 = 0; uVar6 < RCFs->nofFams; uVar6 = uVar6 + 1) {
        free(rows_00[uVar6]);
      }
      free(rows_00);
      free(empty_cycle);
      return;
    }
    for (uVar10 = 0; uVar10 < uInfo->nofProtos[uVar6]; uVar10 = uVar10 + 1) {
      uVar4 = RDL_idxWeights(uInfo,(uint)uVar6,(uint)uVar10);
      cycle = (uchar *)malloc(uVar7);
      memcpy(cycle,rows_00[uVar4],uVar7);
      for (uVar11 = 0; uVar1 != uVar11; uVar11 = uVar11 + 1) {
        uVar2 = RDL_bitset_test(cycle,(uint)uVar11);
        if (uVar2 != '\0') {
          RDL_bitset_xor_inplace(cycle,rows[uVar11],uVar3);
        }
      }
      iVar5 = RDL_bitset_empty(cycle,empty_cycle,uVar3);
      cycle_00 = cycle;
      if (iVar5 == 0) {
        uVar9 = (ulong)local_a4;
        rows_01[uVar9] = cycle;
        *(uint *)((long)__ptr + uVar9 * 4) = (uint)uVar10;
        RCFs->fams[uVar4]->mark = 1;
        uInfo->URFrel[uVar6][uVar10][uVar10] = '\x01';
        cycle_00 = (uchar *)malloc(uVar7);
        memcpy(cycle_00,cycle,uVar7);
        for (uVar11 = uVar1; uVar11 < local_a0; uVar11 = uVar11 + 1) {
          uVar2 = RDL_bitset_test(cycle_00,(uint)uVar11);
          if (uVar2 != '\0') {
            RDL_bitset_xor_inplace(cycle_00,rows[uVar11],uVar3);
          }
        }
        local_a4 = local_a4 + 1;
        iVar5 = RDL_bitset_empty(cycle_00,empty_cycle,uVar3);
        uVar11 = uVar8;
        if (iVar5 != 0) {
          for (; uVar11 < uVar9; uVar11 = uVar11 + 1) {
            memcpy(cycle_00,cycle,uVar7);
            RDL_bitset_xor_inplace(cycle_00,rows_01[uVar11],uVar3);
            iVar5 = RDL_bitset_empty(cycle_00,empty_cycle,uVar3);
            if (iVar5 != 0) {
              uVar4 = *(uint *)((long)__ptr + uVar11 * 4);
              uInfo->URFrel[uVar6][uVar10][uVar4] = '\x01';
              uInfo->URFrel[uVar6][uVar4][uVar10] = '\x01';
            }
          }
          goto LAB_00104a30;
        }
        rows[local_a0] = cycle_00;
        uVar4 = (uint)local_a0;
        nof_rows = uVar4 + 1;
        uVar2 = RDL_bitset_test(cycle_00,uVar4);
        pos = nof_rows;
        if (uVar2 == '\0') {
          for (; pos < graph->E; pos = pos + 1) {
            uVar2 = RDL_bitset_test(cycle_00,pos);
            if (uVar2 != '\0') {
              RDL_swap_columns(rows,nof_rows,uVar4,pos);
              RDL_swap_columns(rows_01,local_a4,uVar4,pos);
              RDL_swap_columns(rows_00,RCFs->nofFams,uVar4,pos);
              break;
            }
          }
          local_a0 = (ulong)nof_rows;
        }
        else {
          local_a0 = (ulong)nof_rows;
        }
      }
      else {
LAB_00104a30:
        free(cycle_00);
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void RDL_checkDependencies(RDL_cfURF *RCFs, RDL_graph *graph, RDL_URFinfo *uInfo)
{
  unsigned i,j,k, index;

  /* this array contains the basis cycles in row echelon form */
  unsigned char **compressedBasisCycles;
  unsigned maxBasisCyclesSize = graph->E - graph->V + 1;
  unsigned currentBasisCyclesSize = 0;
  unsigned currentBasisCyclesSmallerEnd = 0;
  unsigned oldBasisCyclesSize;
  unsigned compressedSize = 0;

  unsigned char **compressedRelevantCycles;
  unsigned currentRelevantCyclesSize = 0;
  unsigned currentRelevantCyclesSmallerEnd = 0;
  unsigned *relevantCyclesMap;

  unsigned char *compressedCycleWithSmallerAdded;
  unsigned char *compressedCycleWithEqualAdded;
  unsigned char **compressedPrototypesForGaussian;

  const unsigned char* empty_cycle;

  if(RCFs->nofFams < 3) {
    /*if only 0, 1 or 2 families exist, they are all relevant and independent*/
    for(i=0; i<uInfo->nofWeights; ++i) {
      for(j=0; j<uInfo->nofProtos[i]; ++j) {
        uInfo->URFrel[i][j][j] = 1; /*URF-related to itself*/
      }
    }
    for(i=0; i<RCFs->nofFams; ++i) {
      RCFs->fams[i]->mark = 1;
    }
    return;
  }

  compressedBasisCycles = malloc(maxBasisCyclesSize * sizeof(*compressedBasisCycles));
  compressedPrototypesForGaussian = malloc(RCFs->nofFams * sizeof(*compressedPrototypesForGaussian));
  compressedRelevantCycles = malloc(RCFs->nofFams * sizeof(*compressedRelevantCycles));
  relevantCyclesMap = malloc(RCFs->nofFams * sizeof(*relevantCyclesMap));

  /* copy the prototypes for gaussian elimination */
  for (i = 0; i < RCFs->nofFams; ++i) {
    compressedSize = RDL_bitset_compressed(
        &(compressedPrototypesForGaussian[i]), RCFs->fams[i]->prototype, graph->E);
  }
  empty_cycle = malloc(compressedSize * sizeof(*empty_cycle));
  memset((unsigned char*)empty_cycle, 0, compressedSize * sizeof(*empty_cycle));
  /* printf("%d %d\n", compressedSize, graph->E); */

  /* iterate over all weights */
  for (i = 0; i < uInfo->nofWeights; ++i) {
    /* reset indices indication the first index of larger cycles */
    currentBasisCyclesSmallerEnd = currentBasisCyclesSize;
    currentRelevantCyclesSmallerEnd = currentRelevantCyclesSize;
    for (j = 0; j < uInfo->nofProtos[i]; ++j) {

      index = RDL_idxWeights(uInfo, i, j);
      /* copy current cycle */
      compressedCycleWithSmallerAdded = malloc(compressedSize * sizeof(*compressedCycleWithSmallerAdded));
      memcpy(compressedCycleWithSmallerAdded, compressedPrototypesForGaussian[index],
          compressedSize * sizeof(*compressedCycleWithSmallerAdded));

      /*
       * add smaller cycles of the basis (set B<)
       *
       * the basisCycles are in row echelon form (see below), so we add each cycle that
       * has a 1 at position k (all smaller positions are 0, row echelon)
       *
       * [this corresponds to the "add row operation" of gaussian elimination]
       */
      for (k = 0; k < currentBasisCyclesSmallerEnd; ++k) {
        if (RDL_bitset_test(compressedCycleWithSmallerAdded, k)) {
          RDL_bitset_xor_inplace(compressedCycleWithSmallerAdded,
              compressedBasisCycles[k], compressedSize);
        }
      }

      /*
       * if the result is empty, then this cycle linearly depends
       * on smaller cycles of the basis B<
       *
       * => trivial
       * <= is also true because adding more smaller cycles can't make
       * the cycle 0 (how could it?)
       */
      if (RDL_bitset_empty(compressedCycleWithSmallerAdded, empty_cycle, compressedSize)) {
        free(compressedCycleWithSmallerAdded);
        continue;
      }

      /* this cycle does not depend on strictly smaller cycles => relevant */
      compressedRelevantCycles[currentRelevantCyclesSize] = compressedCycleWithSmallerAdded;
      relevantCyclesMap[currentRelevantCyclesSize] = j; /* this is no bug, we really need the "internal" index */
      ++currentRelevantCyclesSize;

      RCFs->fams[index]->mark = 1;
      uInfo->URFrel[i][j][j] = 1; /*URF-related to itself*/

      /* make a copy for adding the equal sized cycles */
      compressedCycleWithEqualAdded = malloc(compressedSize * sizeof(*compressedCycleWithEqualAdded));
      memcpy(compressedCycleWithEqualAdded, compressedCycleWithSmallerAdded,
          compressedSize * sizeof(*compressedCycleWithSmallerAdded));

      /*
       * add equal sized cycles of the basis (set B=)
       *
       * the same arguments as for the smaller cycles apply
       */
      for (k = currentBasisCyclesSmallerEnd; k < currentBasisCyclesSize; ++k) {
        if (RDL_bitset_test(compressedCycleWithEqualAdded, k)) {
          RDL_bitset_xor_inplace(compressedCycleWithEqualAdded,
              compressedBasisCycles[k], compressedSize);
        }
      }

      if (RDL_bitset_empty(compressedCycleWithEqualAdded, empty_cycle, compressedSize)) {
        /*
         * if the cycle depends linearly on any equal sized cycle of the
         * basis (B=), we check all RELEVANT cycles we've seen so far for
         * linear dependence
         *
         * (-1 because we don't have to add the ring to itself)
         */

        for (k = currentRelevantCyclesSmallerEnd; k < currentRelevantCyclesSize-1; ++k) {
          memcpy(compressedCycleWithEqualAdded, compressedCycleWithSmallerAdded,
              compressedSize * sizeof(*compressedCycleWithSmallerAdded));
          RDL_bitset_xor_inplace(compressedCycleWithEqualAdded,
              compressedRelevantCycles[k], compressedSize);
          if (RDL_bitset_empty(compressedCycleWithEqualAdded, empty_cycle, compressedSize)) {
            /*
             * if there is any equal sized cycle that is in fact equal to the current cycle
             * (after adding smaller cycles) => those cycles fulfill URF condition 1 (equal size)
             * and also condition 3 (depended on each other and smaller cycles)
             */
            uInfo->URFrel[i][j][relevantCyclesMap[k]] = 1;
            uInfo->URFrel[i][relevantCyclesMap[k]][j] = 1;
          }
        }

        free(compressedCycleWithEqualAdded);
      }
      else {
        /*
         * the current cycle is also independent of equal sized cycles,
         * so it's part of the basis, add it to B=
         *
         * (so it can't be depedent of any equal sized ring seen so far,
         * so URF relation is out of discussion)
         */
        oldBasisCyclesSize = currentBasisCyclesSize;
        compressedBasisCycles[currentBasisCyclesSize] = compressedCycleWithEqualAdded;
        ++currentBasisCyclesSize;

        /*
         * this is where the magic is happening: ensure that the basis is
         * indeed in row echelon form (we use the property throughout the algorithm)
         *
         * swap columns such that indeed the current ring with index currentBasisCycleSize-1
         * has a 1 at column currentBasisCycleSize-1
         * => ROW ECHELON FORM
         *
         * [this corresponds to the "swap columns operation" of gaussian elimination]
         */
        if (!RDL_bitset_test(compressedCycleWithEqualAdded, oldBasisCyclesSize)) {
          for (k = oldBasisCyclesSize + 1; k < graph->E; ++k) {
            if (RDL_bitset_test(compressedCycleWithEqualAdded, k)) {
              RDL_swap_columns(compressedBasisCycles, currentBasisCyclesSize, oldBasisCyclesSize, k);
              RDL_swap_columns(compressedRelevantCycles, currentRelevantCyclesSize, oldBasisCyclesSize, k);
              RDL_swap_columns(compressedPrototypesForGaussian, RCFs->nofFams, oldBasisCyclesSize, k);
              break;
            }
          }
        }
      }

    }
  }

  for (i = 0; i < currentBasisCyclesSize; ++i) {
    free(compressedBasisCycles[i]);
  }
  free(compressedBasisCycles);

  for (i = 0; i < currentRelevantCyclesSize; ++i) {
    free(compressedRelevantCycles[i]);
  }
  free(compressedRelevantCycles);
  free(relevantCyclesMap);

  for (i = 0; i < RCFs->nofFams; ++i) {
    free(compressedPrototypesForGaussian[i]);
  }
  free(compressedPrototypesForGaussian);
  free((void*)empty_cycle);
}